

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bfset_32_d(void)

{
  uint uVar1;
  uint *puVar2;
  sbyte sVar3;
  uint local_40;
  uint local_30;
  uint64 mask;
  uint *data;
  uint local_10;
  uint width;
  uint offset;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    data._4_4_ = m68ki_read_imm_16();
    local_10 = data._4_4_ >> 6 & 0x1f;
    puVar2 = m68ki_cpu.dar + (m68ki_cpu.ir & 7);
    if ((data._4_4_ & 0x800) != 0) {
      local_10 = m68ki_cpu.dar[data._4_4_ >> 6 & 7];
    }
    if ((data._4_4_ & 0x20) != 0) {
      data._4_4_ = m68ki_cpu.dar[data._4_4_ & 7];
    }
    uVar1 = local_10 & 0x1f;
    local_40 = -1 << (0x20 - (((char)data._4_4_ - 1U & 0x1f) + 1) & 0x1f);
    sVar3 = (sbyte)uVar1;
    if (uVar1 < 0x20) {
      local_30 = local_40 >> sVar3;
    }
    else {
      local_30 = 0;
    }
    if (0x20 - uVar1 < 0x20) {
      local_40 = local_40 << (0x20U - sVar3 & 0x3f);
    }
    else {
      local_40 = 0;
    }
    m68ki_cpu.n_flag = (*puVar2 << sVar3) >> 0x18;
    m68ki_cpu.not_z_flag = *puVar2 & (local_30 | local_40);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    *puVar2 = *puVar2 | local_30 | local_40;
  }
  return;
}

Assistant:

static void m68k_op_bfset_32_d(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint offset = (word2>>6)&31;
		uint width = word2;
		uint* data = &DY;
		uint64 mask;


		if(BIT_B(word2))
			offset = REG_D[offset&7];
		if(BIT_5(word2))
			width = REG_D[width&7];


		offset &= 31;
		width = ((width-1) & 31) + 1;


		mask = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask = ROR_32(mask, offset);

		FLAG_N = NFLAG_32(*data<<offset);
		FLAG_Z = *data & mask;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		*data |= mask;

		return;
	}
	m68ki_exception_illegal();
}